

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

Result * __thiscall
doctest::detail::Expression_lhs::operator_cast_to_Result
          (Result *__return_storage_ptr__,Expression_lhs *this)

{
  Expression_lhs EVar1;
  char *__dest;
  bool bVar2;
  anon_union_24_2_13149d16_for_String_2 local_30;
  
  bVar2 = **(int **)this != 0;
  EVar1 = this[9];
  if ((bVar2 == (bool)((byte)EVar1 & 1)) || (*(char *)(g_cs + 0x6c) == '\x01')) {
    doctest::toString((String *)&local_30.data,**(int **)this);
    __return_storage_ptr__->m_passed = (bool)((bVar2 ^ (byte)EVar1) & 1);
    if (local_30.buf[0x17] < '\0') {
      __dest = String::allocate(&__return_storage_ptr__->m_decomp,local_30.data.size);
      memcpy(__dest,local_30.data.ptr,(ulong)local_30.data.size);
    }
    else {
      *(ulong *)((long)&(__return_storage_ptr__->m_decomp).field_0 + 0x10) =
           CONCAT17(local_30.buf[0x17],local_30._16_7_);
      (__return_storage_ptr__->m_decomp).field_0.data.ptr = local_30.data.ptr;
      *(ulong *)((long)&(__return_storage_ptr__->m_decomp).field_0 + 8) =
           CONCAT44(local_30.data.capacity,local_30.data.size);
    }
    if ((local_30.buf[0x17] < '\0') && (local_30.data.ptr != (char *)0x0)) {
      operator_delete__(local_30.data.ptr);
    }
  }
  else {
    __return_storage_ptr__->m_passed = true;
    (__return_storage_ptr__->m_decomp).field_0.data.ptr = (char *)0x0;
    (__return_storage_ptr__->m_decomp).field_0.buf[0x17] = '\x17';
  }
  return __return_storage_ptr__;
}

Assistant:

DOCTEST_NOINLINE operator Result() {
// this is needed only for MSVC 2015
                DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4800) // 'int': forcing value to bool
                bool res = static_cast<bool>(lhs);
                DOCTEST_MSVC_SUPPRESS_WARNING_POP
                if(m_at & assertType::is_false) //!OCLINT bitwise operator in conditional
                    res = !res;

                if(!res || getContextOptions()->success)
                    return Result(res, toString(lhs));
                return Result(res);
            }